

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

ListBuilder * __thiscall
capnp::_::PointerBuilder::getStructList
          (ListBuilder *__return_storage_ptr__,PointerBuilder *this,StructSize elementSize,
          word *defaultValue)

{
  word *defaultValue_local;
  PointerBuilder *this_local;
  StructSize elementSize_local;
  
  WireHelpers::getWritableStructListPointer
            (__return_storage_ptr__,this->pointer,this->segment,this->capTable,elementSize,
             defaultValue);
  return __return_storage_ptr__;
}

Assistant:

ListBuilder PointerBuilder::getStructList(StructSize elementSize, const word* defaultValue) {
  return WireHelpers::getWritableStructListPointer(
      pointer, segment, capTable, elementSize, defaultValue);
}